

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

Vec_Int_t * Abc_FrameDeriveStatusArray(Vec_Ptr_t *vCexes)

{
  Vec_Int_t *p;
  void *pvVar1;
  long lVar2;
  
  if (vCexes == (Vec_Ptr_t *)0x0) {
    p = (Vec_Int_t *)0x0;
  }
  else {
    p = Vec_IntAlloc(vCexes->nSize);
    Vec_IntFill(p,vCexes->nSize,-1);
    for (lVar2 = 0; lVar2 < vCexes->nSize; lVar2 = lVar2 + 1) {
      pvVar1 = Vec_PtrEntry(vCexes,(int)lVar2);
      if (pvVar1 != (void *)0x0) {
        if (p->nSize <= lVar2) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p->pArray[lVar2] = 0;
      }
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_FrameDeriveStatusArray( Vec_Ptr_t * vCexes )
{
    Vec_Int_t * vStatuses;
    Abc_Cex_t * pCex;
    int i;
    if ( vCexes == NULL )
        return NULL;
    vStatuses = Vec_IntAlloc( Vec_PtrSize(vCexes) );
    Vec_IntFill( vStatuses, Vec_PtrSize(vCexes), -1 ); // assume UNDEC
    Vec_PtrForEachEntry( Abc_Cex_t *, vCexes, pCex, i )
        if ( pCex != NULL )
            Vec_IntWriteEntry( vStatuses, i, 0 ); // set this output as SAT
    return vStatuses;    
}